

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_binding.hpp
# Opt level: O3

any * shadow::pointer_detail::generic_dereference_bind_point<long_double>
                (any *__return_storage_ptr__,any *value)

{
  _func_int **pp_Var1;
  holder_base *phVar2;
  
  phVar2 = (holder_base *)((long)&value->field_1 + 8);
  if (value->on_heap_ != false) {
    phVar2 = (value->field_1).heap + 1;
  }
  pp_Var1 = phVar2->_vptr_holder_base;
  __return_storage_ptr__->on_heap_ = true;
  phVar2 = (holder_base *)operator_new(0x20);
  phVar2->_vptr_holder_base = (_func_int **)&PTR_copy_0012ebc8;
  *(unkbyte10 *)(phVar2 + 2) = *(unkbyte10 *)pp_Var1;
  (__return_storage_ptr__->field_1).heap = phVar2;
  return __return_storage_ptr__;
}

Assistant:

inline any
generic_dereference_bind_point(any& value)
{
    return any(*(value.get<T*>()));
}